

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

Sbd_Sto_t *
Sbd_StoAlloc(Gia_Man_t *pGia,Vec_Int_t *vMirrors,int nLutSize,int nCutSize,int nCutNum,int fCutMin,
            int fVerbose)

{
  int iVar1;
  Sbd_Sto_t *pSVar2;
  abctime aVar3;
  Vec_Int_t *pVVar4;
  Vec_Wec_t *pVVar5;
  Vec_Mem_t *local_38;
  Sbd_Sto_t *p;
  int fCutMin_local;
  int nCutNum_local;
  int nCutSize_local;
  int nLutSize_local;
  Vec_Int_t *vMirrors_local;
  Gia_Man_t *pGia_local;
  
  if (nCutSize < nLutSize) {
    __assert_fail("nLutSize <= nCutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x29e,
                  "Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)");
  }
  if (0xe < nCutSize) {
    __assert_fail("nCutSize < SBD_CUT_NO_LEAF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x29f,
                  "Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)");
  }
  if ((nCutSize < 2) || (10 < nCutSize)) {
    __assert_fail("nCutSize > 1 && nCutSize <= SBD_MAX_CUTSIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x2a0,
                  "Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)");
  }
  if ((1 < nCutNum) && (nCutNum < 0x1f5)) {
    pSVar2 = (Sbd_Sto_t *)calloc(1,0x187f8);
    aVar3 = Abc_Clock();
    pSVar2->clkStart = aVar3;
    pSVar2->nLutSize = nLutSize;
    pSVar2->nCutSize = nCutSize;
    pSVar2->nCutNum = nCutNum;
    pSVar2->fCutMin = fCutMin;
    pSVar2->fVerbose = fVerbose;
    pSVar2->pGia = pGia;
    pSVar2->vMirrors = vMirrors;
    iVar1 = Gia_ManObjNum(pGia);
    pVVar4 = Vec_IntStart(iVar1);
    pSVar2->vDelays = pVVar4;
    iVar1 = Gia_ManObjNum(pGia);
    pVVar4 = Vec_IntStart(iVar1);
    pSVar2->vLevels = pVVar4;
    iVar1 = Gia_ManObjNum(pGia);
    pVVar4 = Vec_IntAlloc(iVar1);
    pSVar2->vRefs = pVVar4;
    iVar1 = Gia_ManObjNum(pGia);
    pVVar5 = Vec_WecStart(iVar1);
    pSVar2->vCuts = pVVar5;
    if (fCutMin == 0) {
      local_38 = (Vec_Mem_t *)0x0;
    }
    else {
      local_38 = Vec_MemAllocForTT(nCutSize,0);
    }
    pSVar2->vTtMem = local_38;
    return pSVar2;
  }
  __assert_fail("nCutNum > 1 && nCutNum < SBD_MAX_CUTNUM",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                ,0x2a1,"Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)")
  ;
}

Assistant:

Sbd_Sto_t * Sbd_StoAlloc( Gia_Man_t * pGia, Vec_Int_t * vMirrors, int nLutSize, int nCutSize, int nCutNum, int fCutMin, int fVerbose )
{
    Sbd_Sto_t * p;
    assert( nLutSize <= nCutSize );
    assert( nCutSize < SBD_CUT_NO_LEAF );
    assert( nCutSize > 1 && nCutSize <= SBD_MAX_CUTSIZE );
    assert( nCutNum > 1 && nCutNum < SBD_MAX_CUTNUM );
    p = ABC_CALLOC( Sbd_Sto_t, 1 );
    p->clkStart = Abc_Clock();
    p->nLutSize = nLutSize;
    p->nCutSize = nCutSize;
    p->nCutNum  = nCutNum;
    p->fCutMin  = fCutMin;
    p->fVerbose = fVerbose;
    p->pGia     = pGia;
    p->vMirrors = vMirrors;
    p->vDelays  = Vec_IntStart( Gia_ManObjNum(pGia) );
    p->vLevels  = Vec_IntStart( Gia_ManObjNum(pGia) );
    p->vRefs    = Vec_IntAlloc( Gia_ManObjNum(pGia) );
    p->vCuts    = Vec_WecStart( Gia_ManObjNum(pGia) );
    p->vTtMem   = fCutMin ? Vec_MemAllocForTT( nCutSize, 0 ) : NULL;
    return p;
}